

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

int AddTimeout(stTimeout_t *apTimeout,stTimeoutItem_t *apItem,unsigned_long_long allNow)

{
  ulong local_30;
  unsigned_long_long diff;
  unsigned_long_long allNow_local;
  stTimeoutItem_t *apItem_local;
  stTimeout_t *apTimeout_local;
  
  if (apTimeout->ullStart == 0) {
    apTimeout->ullStart = allNow;
    apTimeout->llStartIdx = 0;
  }
  if (allNow < apTimeout->ullStart) {
    co_log_err("CO_ERR: AddTimeout line %d allNow %llu apTimeout->ullStart %llu",0x186,allNow,
               apTimeout->ullStart);
    apTimeout_local._4_4_ = 0x188;
  }
  else if (apItem->ullExpireTime < allNow) {
    co_log_err("CO_ERR: AddTimeout line %d apItem->ullExpireTime %llu allNow %llu apTimeout->ullStart %llu"
               ,0x18d,apItem->ullExpireTime,allNow,apTimeout->ullStart);
    apTimeout_local._4_4_ = 399;
  }
  else {
    local_30 = apItem->ullExpireTime - apTimeout->ullStart;
    if ((ulong)(long)apTimeout->iItemSize <= local_30) {
      local_30 = (ulong)(apTimeout->iItemSize + -1);
      co_log_err("CO_ERR: AddTimeout line %d diff %d",0x197,local_30);
    }
    AddTail<stTimeoutItem_t,stTimeoutItemLink_t>
              (apTimeout->pItems +
               (apTimeout->llStartIdx + local_30) % (ulong)(long)apTimeout->iItemSize,apItem);
    apTimeout_local._4_4_ = 0;
  }
  return apTimeout_local._4_4_;
}

Assistant:

int AddTimeout( stTimeout_t *apTimeout,stTimeoutItem_t *apItem ,unsigned long long allNow )
{
	if( apTimeout->ullStart == 0 )
	{
		apTimeout->ullStart = allNow;
		apTimeout->llStartIdx = 0;
	}
	if( allNow < apTimeout->ullStart )
	{
		co_log_err("CO_ERR: AddTimeout line %d allNow %llu apTimeout->ullStart %llu",
					__LINE__,allNow,apTimeout->ullStart);

		return __LINE__;
	}
	if( apItem->ullExpireTime < allNow )
	{
		co_log_err("CO_ERR: AddTimeout line %d apItem->ullExpireTime %llu allNow %llu apTimeout->ullStart %llu",
					__LINE__,apItem->ullExpireTime,allNow,apTimeout->ullStart);

		return __LINE__;
	}
	unsigned long long diff = apItem->ullExpireTime - apTimeout->ullStart;

	if( diff >= (unsigned long long)apTimeout->iItemSize )
	{
		diff = apTimeout->iItemSize - 1;
		co_log_err("CO_ERR: AddTimeout line %d diff %d",
					__LINE__,diff);

		//return __LINE__;
	}
	AddTail( apTimeout->pItems + ( apTimeout->llStartIdx + diff ) % apTimeout->iItemSize , apItem );

	return 0;
}